

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall icu_63::Calendar::getRelatedYear(Calendar *this,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  ECalType EVar3;
  undefined4 extraout_var;
  int32_t local_24;
  ECalType type;
  int32_t year;
  UErrorCode *status_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    local_24 = get(this,UCAL_EXTENDED_YEAR,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x17])();
      EVar3 = getCalendarType((char *)CONCAT44(extraout_var,iVar2));
      switch(EVar3) {
      case CALTYPE_PERSIAN:
        local_24 = local_24 + 0x26e;
        break;
      case CALTYPE_ISLAMIC_CIVIL:
      case CALTYPE_ISLAMIC:
      case CALTYPE_ISLAMIC_UMALQURA:
      case CALTYPE_ISLAMIC_TBLA:
      case CALTYPE_ISLAMIC_RGSA:
        local_24 = gregoYearFromIslamicStart(local_24);
        break;
      case CALTYPE_HEBREW:
        local_24 = local_24 + -0xeb0;
        break;
      case CALTYPE_CHINESE:
        local_24 = local_24 + -0xa4d;
        break;
      case CALTYPE_INDIAN:
        local_24 = local_24 + 0x4f;
        break;
      case CALTYPE_COPTIC:
        local_24 = local_24 + 0x11c;
        break;
      case CALTYPE_ETHIOPIC:
        local_24 = local_24 + 8;
        break;
      case CALTYPE_ETHIOPIC_AMETE_ALEM:
        local_24 = local_24 + -0x1574;
        break;
      default:
        break;
      case CALTYPE_DANGI:
        local_24 = local_24 + -0x91d;
      }
      this_local._4_4_ = local_24;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Calendar::getRelatedYear(UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t year = get(UCAL_EXTENDED_YEAR, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year += 622; break;
        case CALTYPE_HEBREW:
            year -= 3760; break;
        case CALTYPE_CHINESE:
            year -= 2637; break;
        case CALTYPE_INDIAN:
            year += 79; break;
        case CALTYPE_COPTIC:
            year += 284; break;
        case CALTYPE_ETHIOPIC:
            year += 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year -=5492; break;
        case CALTYPE_DANGI:
            year -= 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = gregoYearFromIslamicStart(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    return year;
}